

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_lexer.yy.cc
# Opt level: O0

YY_BUFFER_STATE __thiscall yyFlexLexer::yy_create_buffer(yyFlexLexer *this,istream *file,int size)

{
  YY_BUFFER_STATE b_00;
  char *pcVar1;
  YY_BUFFER_STATE b;
  int size_local;
  istream *file_local;
  yyFlexLexer *this_local;
  
  b_00 = (YY_BUFFER_STATE)yyalloc(0x40);
  if (b_00 == (YY_BUFFER_STATE)0x0) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
              (this,"out of dynamic memory in yy_create_buffer()");
  }
  b_00->yy_buf_size = size;
  pcVar1 = (char *)yyalloc((long)(b_00->yy_buf_size + 2));
  b_00->yy_ch_buf = pcVar1;
  if (b_00->yy_ch_buf == (char *)0x0) {
    (*(this->super_FlexLexer)._vptr_FlexLexer[0xe])
              (this,"out of dynamic memory in yy_create_buffer()");
  }
  b_00->yy_is_our_buffer = 1;
  yy_init_buffer(this,b_00,file);
  return b_00;
}

Assistant:

YY_BUFFER_STATE yyFlexLexer::yy_create_buffer( std::istream& file, int size )
/* %endif */
{
	YY_BUFFER_STATE b;
    
	b = (YY_BUFFER_STATE) yyalloc( sizeof( struct yy_buffer_state )  );
	if ( ! b )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_buf_size = size;

	/* yy_ch_buf has to be 2 characters longer than the size given because
	 * we need to put in 2 end-of-buffer characters.
	 */
	b->yy_ch_buf = (char *) yyalloc( (yy_size_t) (b->yy_buf_size + 2)  );
	if ( ! b->yy_ch_buf )
		YY_FATAL_ERROR( "out of dynamic memory in yy_create_buffer()" );

	b->yy_is_our_buffer = 1;

	yy_init_buffer( b, file );

	return b;
}